

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O0

void __thiscall Refal2::CRuleParser::afterVariableType(CRuleParser *this)

{
  bool bVar1;
  allocator local_31;
  string local_30 [32];
  CRuleParser *local_10;
  CRuleParser *this_local;
  
  local_10 = this;
  if ((this->super_CQualifierParser).token.type == TT_LeftParen) {
    CQualifierParser::StartQualifer(&this->super_CQualifierParser);
    this->state = (TState)variableQualifier;
    *(undefined8 *)&this->field_0x1e80 = 0;
  }
  else if ((this->super_CQualifierParser).token.type == TT_Qualifier) {
    bVar1 = CModuleBuilder::GetNamedQualifier
                      ((CModuleBuilder *)this,&(this->super_CQualifierParser).token,&this->qualifier
                      );
    if (bVar1) {
      this->state = (TState)afterVariableQualifier;
      *(undefined8 *)&this->field_0x1e80 = 0;
    }
    else {
      CParsingElementState::SetWrong(&(this->super_CQualifierParser).super_CParsingElementState);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"unexpected token after variable type",&local_31);
    error(this,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

void CRuleParser::afterVariableType()
{
	if( token.type == TT_LeftParen ) {
		CQualifierParser::StartQualifer();
		state = &CRuleParser::variableQualifier;
	} else if( token.type == TT_Qualifier ) {
		if( CModuleBuilder::GetNamedQualifier( token, qualifier ) ) {
			state = &CRuleParser::afterVariableQualifier;
		} else {
			SetWrong();
		}
	} else {
		error( "unexpected token after variable type" );
	}
}